

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::
     format<std::__cxx11::string,std::atomic<int>,std::atomic<int>,std::__cxx11::string,bool,long,std::__cxx11::string,std::__cxx11::string>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               atomic<int> *args_1,atomic<int> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
               bool *args_4,long *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7)

{
  long in_FS_OFFSET;
  FormatList local_f8;
  FormatArg local_e8;
  atomic<int> *local_d0;
  code *local_c8;
  code *local_c0;
  atomic<int> *local_b8;
  code *local_b0;
  code *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  code *local_98;
  code *local_90;
  bool *local_88;
  code *local_80;
  code *local_78;
  long *local_70;
  code *local_68;
  code *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  code *local_50;
  code *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  code *local_38;
  code *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8.m_args = &local_e8;
  local_f8.m_N = 8;
  local_e8.m_formatImpl = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_e8.m_toIntImpl = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_c8 = detail::FormatArg::formatImpl<std::atomic<int>>;
  local_c0 = detail::FormatArg::toIntImpl<std::atomic<int>>;
  local_b0 = detail::FormatArg::formatImpl<std::atomic<int>>;
  local_a8 = detail::FormatArg::toIntImpl<std::atomic<int>>;
  local_98 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_90 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_88 = args_4;
  local_80 = detail::FormatArg::formatImpl<bool>;
  local_78 = detail::FormatArg::toIntImpl<bool>;
  local_70 = args_5;
  local_68 = detail::FormatArg::formatImpl<long>;
  local_60 = detail::FormatArg::toIntImpl<long>;
  local_58 = args_6;
  local_50 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_48 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_40 = args_7;
  local_38 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_30 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_e8.m_value = args;
  local_d0 = args_1;
  local_b8 = args_2;
  local_a0 = args_3;
  vformat(out,fmt,&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}